

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O2

void __thiscall
fizplex::LPTestFeasibility_IsFeasibleForFreeVarAndNonBindingRow_Test::TestBody
          (LPTestFeasibility_IsFeasibleForFreeVarAndNonBindingRow_Test *this)

{
  LP *this_00;
  long lVar1;
  initializer_list<double> l;
  initializer_list<double> l_00;
  initializer_list<double> l_01;
  initializer_list<fizplex::DVector> __l;
  allocator_type local_b9;
  vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> local_b8;
  DVector local_a0;
  DVector local_88;
  DVector local_70;
  double local_58 [6];
  
  this_00 = &(this->super_LPTestFeasibility).lp;
  LP::add_column(this_00,Free,-INFINITY,INFINITY,0.0);
  LP::add_row(this_00,NonBinding,-INFINITY,INFINITY);
  LP::add_value(this_00,0,0,1.0);
  LP::add_logicals(this_00);
  local_58[4] = 0.0;
  local_58[5] = 0.0;
  l._M_len = 2;
  l._M_array = local_58 + 4;
  DVector::DVector(&local_a0,l);
  local_58[2] = -5.0;
  local_58[3] = 5.0;
  l_00._M_len = 2;
  l_00._M_array = local_58 + 2;
  DVector::DVector(&local_88,l_00);
  local_58[0] = 5.0;
  local_58[1] = -5.0;
  l_01._M_len = 2;
  l_01._M_array = local_58;
  DVector::DVector(&local_70,l_01);
  __l._M_len = 3;
  __l._M_array = &local_a0;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector(&local_b8,__l,&local_b9);
  LPTestFeasibility::check_feasible(&this->super_LPTestFeasibility,true,&local_b8);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector(&local_b8);
  lVar1 = 0x30;
  do {
    std::valarray<double>::~valarray((valarray<double> *)((long)&local_a0.vals._M_size + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

TEST_F(LPTestFeasibility, IsFeasibleForFreeVarAndNonBindingRow) {
  lp.add_column(ColType::Free, -inf, inf);
  lp.add_row(RowType::NonBinding, -inf, inf);
  lp.add_value(0, 0, 1.0);
  lp.add_logicals();

  check_feasible(true, {{0, 0}, {-5, 5}, {5, -5}});
}